

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrans_avx2.c
# Opt level: O1

void itrans_dct2_h8_w32_avx2(s16 *src,s16 *dst,int bit_depth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 (*pauVar6) [32];
  ulong uVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  s16 tmp [256];
  s16 local_240 [284];
  
  pauVar6 = (undefined1 (*) [32])local_240;
  uVar7 = 0xfffffffffffffff8;
  auVar15._8_4_ = 0xffe70009;
  auVar15._0_8_ = 0xffe70009ffe70009;
  auVar15._12_4_ = 0xffe70009;
  auVar15._16_4_ = 0xffe70009;
  auVar15._20_4_ = 0xffe70009;
  auVar15._24_4_ = 0xffe70009;
  auVar15._28_4_ = 0xffe70009;
  auVar16._8_4_ = 0xffd40026;
  auVar16._0_8_ = 0xffd40026ffd40026;
  auVar16._12_4_ = 0xffd40026;
  auVar16._16_4_ = 0xffd40026;
  auVar16._20_4_ = 0xffd40026;
  auVar16._24_4_ = 0xffd40026;
  auVar16._28_4_ = 0xffd40026;
  auVar17._8_2_ = 0x20;
  auVar17._0_8_ = 0x20002000200020;
  auVar17._10_2_ = 0x20;
  auVar17._12_2_ = 0x20;
  auVar17._14_2_ = 0x20;
  auVar17._16_2_ = 0x20;
  auVar17._18_2_ = 0x20;
  auVar17._20_2_ = 0x20;
  auVar17._22_2_ = 0x20;
  auVar17._24_2_ = 0x20;
  auVar17._26_2_ = 0x20;
  auVar17._28_2_ = 0x20;
  auVar17._30_2_ = 0x20;
  auVar18._8_4_ = 0xffe00020;
  auVar18._0_8_ = 0xffe00020ffe00020;
  auVar18._12_4_ = 0xffe00020;
  auVar18._16_4_ = 0xffe00020;
  auVar18._20_4_ = 0xffe00020;
  auVar18._24_4_ = 0xffe00020;
  auVar18._28_4_ = 0xffe00020;
  auVar19._8_4_ = 0x11002a;
  auVar19._0_8_ = 0x11002a0011002a;
  auVar19._12_4_ = 0x11002a;
  auVar19._16_4_ = 0x11002a;
  auVar19._20_4_ = 0x11002a;
  auVar19._24_4_ = 0x11002a;
  auVar19._28_4_ = 0x11002a;
  auVar20._8_4_ = 0xffd60011;
  auVar20._0_8_ = 0xffd60011ffd60011;
  auVar20._12_4_ = 0xffd60011;
  auVar20._16_4_ = 0xffd60011;
  auVar20._20_4_ = 0xffd60011;
  auVar20._24_4_ = 0xffd60011;
  auVar20._28_4_ = 0xffd60011;
  auVar21._8_4_ = 0x10;
  auVar21._0_8_ = 0x1000000010;
  auVar21._12_4_ = 0x10;
  auVar21._16_4_ = 0x10;
  auVar21._20_4_ = 0x10;
  auVar21._24_4_ = 0x10;
  auVar21._28_4_ = 0x10;
  do {
    auVar3 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + uVar7 + 0x28),
                            *(undefined1 (*) [16])(src + uVar7 + 0x68));
    auVar1 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + uVar7 + 0x28),
                            *(undefined1 (*) [16])(src + uVar7 + 0x68));
    auVar4 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + uVar7 + 0xa8),
                            *(undefined1 (*) [16])(src + uVar7 + 0xe8));
    auVar2 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + uVar7 + 0xa8),
                            *(undefined1 (*) [16])(src + uVar7 + 0xe8));
    auVar11._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar3;
    auVar11._16_16_ = ZEXT116(1) * auVar1;
    auVar23 = vpmaddwd_avx2(auVar11,_DAT_0017f620);
    auVar22._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar4;
    auVar22._16_16_ = ZEXT116(1) * auVar2;
    auVar9 = vpmaddwd_avx2(auVar22,_DAT_0017f640);
    auVar23 = vpaddd_avx2(auVar9,auVar23);
    auVar9 = vpmaddwd_avx2(auVar11,_DAT_0017f660);
    auVar13 = vpmaddwd_avx2(auVar22,_DAT_0017f680);
    auVar9 = vpaddd_avx2(auVar13,auVar9);
    auVar13 = vpmaddwd_avx2(auVar11,_DAT_0017f6a0);
    auVar10 = vpmaddwd_avx2(auVar22,_DAT_0017f6c0);
    auVar13 = vpaddd_avx2(auVar10,auVar13);
    auVar10 = vpmaddwd_avx2(auVar11,auVar15);
    auVar22 = vpmaddwd_avx2(auVar22,auVar16);
    auVar10 = vpaddd_avx2(auVar22,auVar10);
    auVar3 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + uVar7 + 8),
                            *(undefined1 (*) [16])(src + uVar7 + 0x88));
    auVar1 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + uVar7 + 8),
                            *(undefined1 (*) [16])(src + uVar7 + 0x88));
    auVar4 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + uVar7 + 0x48),
                            *(undefined1 (*) [16])(src + uVar7 + 200));
    auVar2 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + uVar7 + 0x48),
                            *(undefined1 (*) [16])(src + uVar7 + 200));
    auVar12._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar3;
    auVar12._16_16_ = ZEXT116(1) * auVar1;
    auVar22 = vpmaddwd_avx2(auVar17,auVar12);
    auVar12 = vpmaddwd_avx2(auVar18,auVar12);
    auVar8._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar4;
    auVar8._16_16_ = ZEXT116(1) * auVar2;
    auVar11 = vpmaddwd_avx2(auVar19,auVar8);
    auVar8 = vpmaddwd_avx2(auVar20,auVar8);
    auVar14 = vpsubd_avx2(auVar22,auVar11);
    auVar22 = vpaddd_avx2(auVar21,auVar22);
    auVar22 = vpaddd_avx2(auVar22,auVar11);
    auVar5 = vpsubd_avx2(auVar12,auVar8);
    auVar11 = vpaddd_avx2(auVar14,auVar21);
    auVar12 = vpaddd_avx2(auVar12,auVar8);
    auVar12 = vpaddd_avx2(auVar21,auVar12);
    auVar8 = vpaddd_avx2(auVar21,auVar5);
    auVar14 = vpaddd_avx2(auVar23,auVar22);
    auVar5 = vpsubd_avx2(auVar22,auVar23);
    auVar22 = vpaddd_avx2(auVar9,auVar12);
    auVar9 = vpsubd_avx2(auVar12,auVar9);
    auVar23 = vpaddd_avx2(auVar8,auVar13);
    auVar12 = vpsubd_avx2(auVar8,auVar13);
    auVar13 = vpaddd_avx2(auVar11,auVar10);
    auVar10 = vpsubd_avx2(auVar11,auVar10);
    auVar9 = vpsrad_avx2(auVar9,5);
    auVar23 = vpsrad_avx2(auVar23,5);
    auVar23 = vpackssdw_avx2(auVar23,auVar9);
    auVar22 = vpsrad_avx2(auVar22,5);
    auVar9 = vpsrad_avx2(auVar12,5);
    auVar9 = vpackssdw_avx2(auVar22,auVar9);
    auVar22 = vpsrad_avx2(auVar5,5);
    auVar13 = vpsrad_avx2(auVar13,5);
    auVar13 = vpackssdw_avx2(auVar13,auVar22);
    auVar22 = vpsrad_avx2(auVar14,5);
    auVar10 = vpsrad_avx2(auVar10,5);
    auVar10 = vpackssdw_avx2(auVar22,auVar10);
    auVar22 = vpunpcklwd_avx2(auVar10,auVar23);
    auVar23 = vpunpckhwd_avx2(auVar10,auVar23);
    auVar10 = vpunpcklwd_avx2(auVar9,auVar13);
    auVar9 = vpunpckhwd_avx2(auVar9,auVar13);
    auVar11 = vpunpcklwd_avx2(auVar22,auVar10);
    auVar13 = vpunpckhwd_avx2(auVar22,auVar10);
    auVar10 = vpunpcklwd_avx2(auVar23,auVar9);
    auVar23 = vpunpckhwd_avx2(auVar23,auVar9);
    auVar22 = vpunpcklqdq_avx2(auVar11,auVar10);
    auVar9 = vpunpckhqdq_avx2(auVar11,auVar10);
    auVar10 = vpunpcklqdq_avx2(auVar13,auVar23);
    auVar23 = vpunpckhqdq_avx2(auVar13,auVar23);
    auVar13._0_16_ = ZEXT116(0) * auVar9._0_16_ + ZEXT116(1) * auVar22._0_16_;
    auVar13._16_16_ = ZEXT116(0) * auVar22._16_16_ + ZEXT116(1) * auVar9._0_16_;
    auVar9 = vperm2i128_avx2(auVar22,auVar9,0x31);
    auVar14._0_16_ = ZEXT116(0) * auVar23._0_16_ + ZEXT116(1) * auVar10._0_16_;
    auVar14._16_16_ = ZEXT116(0) * auVar10._16_16_ + ZEXT116(1) * auVar23._0_16_;
    auVar23 = vperm2i128_avx2(auVar10,auVar23,0x31);
    *pauVar6 = auVar13;
    pauVar6[1] = auVar14;
    pauVar6[2] = auVar9;
    pauVar6[3] = auVar23;
    pauVar6 = pauVar6 + 4;
    uVar7 = uVar7 + 8;
  } while (uVar7 < 0x18);
  dct2_butterfly_h32_avx2(local_240,8,dst,8,0x14 - bit_depth,bit_depth);
  return;
}

Assistant:

void itrans_dct2_h8_w32_avx2(s16 *src, s16 *dst, int bit_depth)
{
    ALIGNED_32(s16 tmp[8 * 32]);
    dct2_butterfly_h8_avx2(src, 32, tmp, 32, 5, MAX_TX_DYNAMIC_RANGE);
    dct2_butterfly_h32_avx2(tmp, 8, dst, 8, 20 - bit_depth, bit_depth);
}